

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O2

bool inipp::extract<char,bool>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,bool *dst)

{
  uint *puVar1;
  istream *piVar2;
  bool bVar3;
  bool result;
  char c;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> is;
  uint auStack_178 [90];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)value,_S_in);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(_is + -0x18));
  *puVar1 = *puVar1 | 1;
  piVar2 = std::istream::_M_extract<bool>((bool *)&is);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    piVar2 = std::operator>>((istream *)&is,&c);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      *dst = result;
      bVar3 = true;
      goto LAB_0010b128;
    }
  }
  bVar3 = false;
LAB_0010b128:
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  return bVar3;
}

Assistant:

inline bool extract(const std::basic_string<CharT> & value, T & dst) {
	CharT c;
	std::basic_istringstream<CharT> is{ value };
	T result;
	if ((is >> std::boolalpha >> result) && !(is >> c)) {
		dst = result;
		return true;
	}
	else {
		return false;
	}
}